

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

bool iutest::internal::iuOperatorEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
               (char (*v1) [4],basic_string_view<char,_std::char_traits<char>_> *v2)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  
  __n = strlen(*v1);
  if (__n == v2->_M_len) {
    if (__n != 0) {
      iVar2 = bcmp(v1,v2->_M_str,__n);
      if (iVar2 != 0) goto LAB_00166b1f;
    }
    bVar1 = true;
  }
  else {
LAB_00166b1f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}